

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O2

Individual *
Individual::makeRandom(Individual *__return_storage_ptr__,shared_ptr<Instance> *instance)

{
  int iVar1;
  element_type *peVar2;
  pointer pTVar3;
  long lVar4;
  int iVar5;
  reference pvVar6;
  size_type __n;
  ulong uVar7;
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  peVar2 = (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pTVar3 = (peVar2->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)(peVar2->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                super__Vector_impl_data._M_start;
  iVar1 = peVar2->numProcessors;
  std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,&instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>);
  uVar7 = (ulong)((long)pTVar3 - lVar4) >> 3;
  iVar5 = (int)uVar7;
  Individual(__return_storage_ptr__,(shared_ptr<Instance> *)&_Stack_38,(long)iVar5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  __n = 0;
  uVar7 = uVar7 & 0xffffffff;
  if (iVar5 < 1) {
    uVar7 = __n;
  }
  for (; uVar7 != __n; __n = __n + 1) {
    iVar5 = rand();
    pvVar6 = std::vector<int,_std::allocator<int>_>::at
                       (&__return_storage_ptr__->coresAsignedToTasks,__n);
    *pvVar6 = iVar5 % iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Individual Individual::makeRandom(std::shared_ptr<Instance> instance){
	int numberOfTasks = instance->getNumTasks();
	int numerOfCores = instance->getNumProcessors();
	Individual outcome(instance, numberOfTasks);
	for(int i = 0; i < numberOfTasks; i++){
		int randomCore = rand() % numerOfCores;
		outcome.coresAsignedToTasks.at(i) = randomCore;
	}
	return outcome;
}